

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void P_CheckPlayerSprite(AActor *actor,int *spritenum,DVector2 *scale)

{
  player_t *ppVar1;
  FPlayerSkin *pFVar2;
  FPlayerSkin *pFVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  AActor *pAVar7;
  bool bVar8;
  TFlags<ActorFlag4,_unsigned_int> local_44;
  undefined1 local_40 [8];
  DVector2 defscale;
  int crouchspriteno;
  player_t *player;
  DVector2 *scale_local;
  int *spritenum_local;
  AActor *actor_local;
  
  ppVar1 = actor->player;
  iVar4 = userinfo_t::GetSkin(&ppVar1->userinfo);
  bVar8 = false;
  if (iVar4 != 0) {
    TFlags<ActorFlag4,_unsigned_int>::operator&
              ((TFlags<ActorFlag4,_unsigned_int> *)&defscale.Y,
               (int)actor + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
    uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&defscale.Y);
    bVar8 = uVar5 == 0;
  }
  if (bVar8) {
    pAVar7 = AActor::GetDefault(actor);
    TVector2<double>::TVector2((TVector2<double> *)local_40,&pAVar7->Scale);
    pFVar2 = skins;
    iVar4 = userinfo_t::GetSkin(&ppVar1->userinfo);
    scale->X = (pFVar2[iVar4].Scale.X / (double)local_40) * scale->X;
    pFVar2 = skins;
    iVar4 = userinfo_t::GetSkin(&ppVar1->userinfo);
    scale->Y = (pFVar2[iVar4].Scale.Y / defscale.X) * scale->Y;
  }
  if (ppVar1->crouchfactor <= 0.75 && ppVar1->crouchfactor != 0.75) {
    if ((*spritenum == (uint)actor->SpawnState->sprite) ||
       (*spritenum == *(int *)&(ppVar1->mo->super_AActor).field_0x49c)) {
      defscale.Y._4_4_ = *(int *)&(ppVar1->mo->super_AActor).field_0x49c;
    }
    else {
      TFlags<ActorFlag4,_unsigned_int>::operator&
                (&local_44,
                 (int)actor + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
      uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
      pFVar2 = skins;
      bVar8 = false;
      if (uVar5 == 0) {
        iVar4 = *spritenum;
        iVar6 = userinfo_t::GetSkin(&ppVar1->userinfo);
        pFVar3 = skins;
        bVar8 = true;
        if (iVar4 != pFVar2[iVar6].sprite) {
          iVar4 = *spritenum;
          iVar6 = userinfo_t::GetSkin(&ppVar1->userinfo);
          bVar8 = iVar4 == pFVar3[iVar6].crouchsprite;
        }
      }
      pFVar2 = skins;
      if (bVar8) {
        iVar4 = userinfo_t::GetSkin(&ppVar1->userinfo);
        defscale.Y._4_4_ = pFVar2[iVar4].crouchsprite;
      }
      else {
        defscale.Y._4_4_ = -1;
      }
    }
    if (defscale.Y._4_4_ < 1) {
      if ((ppVar1->playerstate != '\x01') &&
         (ppVar1->crouchfactor <= 0.75 && ppVar1->crouchfactor != 0.75)) {
        scale->Y = scale->Y * 0.5;
      }
    }
    else {
      *spritenum = defscale.Y._4_4_;
    }
  }
  return;
}

Assistant:

void P_CheckPlayerSprite(AActor *actor, int &spritenum, DVector2 &scale)
{
	player_t *player = actor->player;
	int crouchspriteno;

	if (player->userinfo.GetSkin() != 0 && !(actor->flags4 & MF4_NOSKIN))
	{
		// Convert from default scale to skin scale.
		DVector2 defscale = actor->GetDefault()->Scale;
		scale.X *= skins[player->userinfo.GetSkin()].Scale.X / defscale.X;
		scale.Y *= skins[player->userinfo.GetSkin()].Scale.Y / defscale.Y;
	}

	// Set the crouch sprite?
	if (player->crouchfactor < 0.75)
	{
		if (spritenum == actor->SpawnState->sprite || spritenum == player->mo->crouchsprite) 
		{
			crouchspriteno = player->mo->crouchsprite;
		}
		else if (!(actor->flags4 & MF4_NOSKIN) &&
				(spritenum == skins[player->userinfo.GetSkin()].sprite ||
				 spritenum == skins[player->userinfo.GetSkin()].crouchsprite))
		{
			crouchspriteno = skins[player->userinfo.GetSkin()].crouchsprite;
		}
		else
		{ // no sprite -> squash the existing one
			crouchspriteno = -1;
		}

		if (crouchspriteno > 0) 
		{
			spritenum = crouchspriteno;
		}
		else if (player->playerstate != PST_DEAD && player->crouchfactor < 0.75)
		{
			scale.Y *= 0.5;
		}
	}
}